

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

int kex_method_diffie_hellman_group_exchange_sha256_key_exchange
              (LIBSSH2_SESSION *session,key_exchange_state_low_t *key_state)

{
  int iVar1;
  BIGNUM *pBVar2;
  size_t data_len;
  char *errmsg;
  size_t p_len;
  size_t g_len;
  uchar *g;
  uchar *p;
  EVP_MD_CTX *exchange_hash_ctx;
  string_buf local_30;
  
  iVar1 = 0;
  switch(key_state->state) {
  case libssh2_NB_state_idle:
    pBVar2 = BN_new();
    key_state->p = (BIGNUM *)pBVar2;
    pBVar2 = BN_new();
    key_state->g = (BIGNUM *)pBVar2;
    key_state->request[0] = '\"';
    _libssh2_htonu32(key_state->request + 1,0x800);
    _libssh2_htonu32(key_state->request + 5,0x1000);
    _libssh2_htonu32(key_state->request + 9,0x2000);
    key_state->request_len = 0xd;
    key_state->state = libssh2_NB_state_created;
    data_len = 0xd;
    break;
  default:
    goto switchD_001158f2_caseD_1;
  case libssh2_NB_state_created:
    data_len = key_state->request_len;
    break;
  case libssh2_NB_state_sent:
    goto switchD_001158f2_caseD_3;
  case libssh2_NB_state_sent1:
    goto switchD_001158f2_caseD_4;
  }
  iVar1 = _libssh2_transport_send(session,key_state->request,data_len,(uchar *)0x0,0);
  if (iVar1 == -0x25) {
    return -0x25;
  }
  if (iVar1 == 0) {
    key_state->state = libssh2_NB_state_sent;
switchD_001158f2_caseD_3:
    iVar1 = _libssh2_packet_require
                      (session,'\x1f',&key_state->data,&key_state->data_len,0,(uchar *)0x0,0,
                       &key_state->req_state);
    if (iVar1 == -0x25) {
      return -0x25;
    }
    if (iVar1 == 0) {
      key_state->state = libssh2_NB_state_sent1;
switchD_001158f2_caseD_4:
      if (key_state->data_len < 9) {
        errmsg = "Unexpected key length DH-SHA256";
      }
      else {
        local_30.data = key_state->data;
        local_30.dataptr = local_30.data + 1;
        local_30.len = key_state->data_len;
        iVar1 = _libssh2_get_bignum_bytes(&local_30,&p,&p_len);
        if (iVar1 == 0) {
          iVar1 = _libssh2_get_bignum_bytes(&local_30,&g,&g_len);
          if (iVar1 == 0) {
            BN_bin2bn(p,(int)p_len,(BIGNUM *)key_state->p);
            BN_bin2bn(g,(int)g_len,(BIGNUM *)key_state->g);
            iVar1 = diffie_hellman_sha_algo
                              (session,key_state->g,key_state->p,(int)p_len,0x100,&exchange_hash_ctx
                               ,' ','!',key_state->data + 1,key_state->data_len - 1,
                               &key_state->exchange_state);
            if (iVar1 == -0x25) {
              return -0x25;
            }
            (*session->free)(key_state->data,&session->abstract);
            goto switchD_001158f2_caseD_1;
          }
          errmsg = "Unexpected value DH-SHA256 g";
        }
        else {
          errmsg = "Unexpected value DH-SHA256 p";
        }
      }
      iVar1 = -0xe;
    }
    else {
      errmsg = "Timeout waiting for GEX_GROUP reply SHA256";
    }
  }
  else {
    errmsg = "Unable to send Group Exchange Request SHA256";
  }
  iVar1 = _libssh2_error(session,iVar1,errmsg);
switchD_001158f2_caseD_1:
  key_state->state = libssh2_NB_state_idle;
  BN_clear_free((BIGNUM *)key_state->g);
  key_state->g = (BIGNUM *)0x0;
  BN_clear_free((BIGNUM *)key_state->p);
  key_state->p = (BIGNUM *)0x0;
  return iVar1;
}

Assistant:

static int
kex_method_diffie_hellman_group_exchange_sha256_key_exchange(
                                          LIBSSH2_SESSION * session,
                                          key_exchange_state_low_t * key_state)
{
    int ret = 0;
    int rc;

    if(key_state->state == libssh2_NB_state_idle) {
        key_state->p = _libssh2_bn_init();
        key_state->g = _libssh2_bn_init();
        /* Ask for a P and G pair */
        key_state->request[0] = SSH_MSG_KEX_DH_GEX_REQUEST;
        _libssh2_htonu32(key_state->request + 1, LIBSSH2_DH_GEX_MINGROUP);
        _libssh2_htonu32(key_state->request + 5, LIBSSH2_DH_GEX_OPTGROUP);
        _libssh2_htonu32(key_state->request + 9, LIBSSH2_DH_GEX_MAXGROUP);
        key_state->request_len = 13;
        _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                       "Initiating Diffie-Hellman Group-Exchange SHA256"));

        key_state->state = libssh2_NB_state_created;
    }

    if(key_state->state == libssh2_NB_state_created) {
        rc = _libssh2_transport_send(session, key_state->request,
                                     key_state->request_len, NULL, 0);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Unable to send "
                                 "Group Exchange Request SHA256");
            goto dh_gex_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent;
    }

    if(key_state->state == libssh2_NB_state_sent) {
        rc = _libssh2_packet_require(session, SSH_MSG_KEX_DH_GEX_GROUP,
                                     &key_state->data, &key_state->data_len,
                                     0, NULL, 0, &key_state->req_state);
        if(rc == LIBSSH2_ERROR_EAGAIN) {
            return rc;
        }
        else if(rc) {
            ret = _libssh2_error(session, rc,
                                 "Timeout waiting for GEX_GROUP reply SHA256");
            goto dh_gex_clean_exit;
        }

        key_state->state = libssh2_NB_state_sent1;
    }

    if(key_state->state == libssh2_NB_state_sent1) {
        unsigned char *p, *g;
        size_t p_len, g_len;
        struct string_buf buf;
        libssh2_sha256_ctx exchange_hash_ctx;

        if(key_state->data_len < 9) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected key length DH-SHA256");
            goto dh_gex_clean_exit;
        }

        buf.data = key_state->data;
        buf.dataptr = buf.data;
        buf.len = key_state->data_len;

        buf.dataptr++; /* increment to big num */

        if(_libssh2_get_bignum_bytes(&buf, &p, &p_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected value DH-SHA256 p");
            goto dh_gex_clean_exit;
        }

        if(_libssh2_get_bignum_bytes(&buf, &g, &g_len)) {
            ret = _libssh2_error(session, LIBSSH2_ERROR_PROTO,
                                 "Unexpected value DH-SHA256 g");
            goto dh_gex_clean_exit;
        }

        _libssh2_bn_from_bin(key_state->p, p_len, p);
        _libssh2_bn_from_bin(key_state->g, g_len, g);

        ret = diffie_hellman_sha_algo(session, key_state->g, key_state->p,
                                      (int)p_len, 256,
                                      (void *)&exchange_hash_ctx,
                                      SSH_MSG_KEX_DH_GEX_INIT,
                                      SSH_MSG_KEX_DH_GEX_REPLY,
                                      key_state->data + 1,
                                      key_state->data_len - 1,
                                      &key_state->exchange_state);
        if(ret == LIBSSH2_ERROR_EAGAIN) {
            return ret;
        }

        LIBSSH2_FREE(session, key_state->data);
    }

dh_gex_clean_exit:
    key_state->state = libssh2_NB_state_idle;
    _libssh2_bn_free(key_state->g);
    key_state->g = NULL;
    _libssh2_bn_free(key_state->p);
    key_state->p = NULL;

    return ret;
}